

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

SortNode * __thiscall GLDrawList::DoSort(GLDrawList *this,SortNode *head)

{
  GLDrawItemType GVar1;
  SortNode *pSVar2;
  SortNode *pSVar3;
  GLDrawItem *pGVar4;
  SortNode *next;
  SortNode *sn;
  SortNode *node;
  SortNode *head_local;
  GLDrawList *this_local;
  
  pSVar3 = FindSortPlane(this,head);
  node = head;
  if (pSVar3 == (SortNode *)0x0) {
    pSVar3 = FindSortWall(this,head);
    if (pSVar3 == (SortNode *)0x0) {
      pSVar3 = SortSpriteList(this,head);
      return pSVar3;
    }
    if (pSVar3 == head) {
      node = head->next;
    }
    SortNode::UnlinkFromChain(pSVar3);
    sn = node;
    pSVar2 = sn;
    while (sn = pSVar2, node = pSVar3, sn != (SortNode *)0x0) {
      pSVar2 = sn->next;
      pGVar4 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)sn->itemindex);
      GVar1 = pGVar4->rendertype;
      if (GVar1 == GLDIT_WALL) {
        SortWallIntoWall(this,pSVar3,sn);
      }
      else if ((GVar1 != GLDIT_FLAT) && (GVar1 == GLDIT_SPRITE)) {
        SortSpriteIntoWall(this,pSVar3,sn);
      }
    }
  }
  else {
    if (pSVar3 == head) {
      node = head->next;
    }
    SortNode::UnlinkFromChain(pSVar3);
    sn = node;
    pSVar2 = sn;
    while (sn = pSVar2, node = pSVar3, sn != (SortNode *)0x0) {
      pSVar2 = sn->next;
      pGVar4 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)sn->itemindex);
      GVar1 = pGVar4->rendertype;
      if (GVar1 == GLDIT_WALL) {
        SortWallIntoPlane(this,pSVar3,sn);
      }
      else if (GVar1 == GLDIT_FLAT) {
        SortPlaneIntoPlane(this,pSVar3,sn);
      }
      else if (GVar1 == GLDIT_SPRITE) {
        SortSpriteIntoPlane(this,pSVar3,sn);
      }
    }
  }
  if (node->left != (SortNode *)0x0) {
    pSVar3 = DoSort(this,node->left);
    node->left = pSVar3;
  }
  if (node->right != (SortNode *)0x0) {
    pSVar3 = DoSort(this,node->right);
    node->right = pSVar3;
  }
  return node;
}

Assistant:

SortNode * GLDrawList::DoSort(SortNode * head)
{
	SortNode * node, * sn, * next;

	sn=FindSortPlane(head);
	if (sn)
	{
		if (sn==head) head=head->next;
		sn->UnlinkFromChain();
		node=head;
		head=sn;
		while (node)
		{
			next=node->next;
			switch(drawitems[node->itemindex].rendertype)
			{
			case GLDIT_FLAT:
				SortPlaneIntoPlane(head,node);
				break;

			case GLDIT_WALL:
				SortWallIntoPlane(head,node);
				break;

			case GLDIT_SPRITE:
				SortSpriteIntoPlane(head,node);
				break;
			}
			node=next;
		}
	}
	else
	{
		sn=FindSortWall(head);
		if (sn)
		{
			if (sn==head) head=head->next;
			sn->UnlinkFromChain();
			node=head;
			head=sn;
			while (node)
			{
				next=node->next;
				switch(drawitems[node->itemindex].rendertype)
				{
				case GLDIT_WALL:
					SortWallIntoWall(head,node);
					break;

				case GLDIT_SPRITE:
					SortSpriteIntoWall(head,node);
					break;

				case GLDIT_FLAT: break;
				}
				node=next;
			}
		}
		else 
		{
			return SortSpriteList(head);
		}
	}
	if (head->left) head->left=DoSort(head->left);
	if (head->right) head->right=DoSort(head->right);
	return sn;
}